

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

void __thiscall
Js::ConcatStringBuilder::ConcatStringBuilder
          (ConcatStringBuilder *this,ScriptContext *scriptContext,int initialSlotCount)

{
  StaticType *type;
  
  type = StringCache::GetStringTypeStatic
                   (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  LiteralString::LiteralString((LiteralString *)this,type);
  (this->super_ConcatStringBase).super_LiteralString.super_JavascriptString.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014f2868;
  (this->m_slots).ptr = (WriteBarrierPtr<Js::JavascriptString> *)0x0;
  this->m_count = 0;
  (this->m_prevChunk).ptr = (ConcatStringBuilder *)0x0;
  AllocateSlots(this,initialSlotCount);
  JavascriptString::SetLength((JavascriptString *)this,0);
  return;
}

Assistant:

ConcatStringBuilder::ConcatStringBuilder(ScriptContext* scriptContext, int initialSlotCount) :
        ConcatStringBase(scriptContext->GetLibrary()->GetStringTypeStatic()),
        m_count(0), m_prevChunk(nullptr)
    {
        Assert(scriptContext);

        // Note: m_slotCount is a valid scenario -- when you don't know how many will be there.
        this->AllocateSlots(initialSlotCount);
        this->SetLength(0); // does not include null character
    }